

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_reader.h
# Opt level: O1

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cppwinrt::reader::files<bool(*)(std::basic_string_view<char,std::char_traits<char>>const&)>
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,reader *this,string_view *name,
          _func_bool_basic_string_view<char,_std::char_traits<char>_>_ptr *directory_filter)

{
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  *p_Var3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  pointer __source;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  smatch match;
  string sdk_version;
  anon_class_16_2_7baea878 add_directory;
  regex rx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  path local_170;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_148;
  _func_bool_basic_string_view<char,_std::char_traits<char>_>_ptr **local_140;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_138;
  path local_130;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string_type local_58;
  _func_bool_basic_string_view<char,_std::char_traits<char>_>_ptr *local_38;
  
  local_140 = &local_38;
  local_108._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_108._M_impl.super__Rb_tree_header._M_header;
  local_108._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_108._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_108._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_138 = &local_108;
  local_148 = __return_storage_ptr__;
  local_108._M_impl.super__Rb_tree_header._M_header._M_right =
       local_108._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = directory_filter;
  pvVar8 = values_abi_cxx11_(this,name);
  __source = (pvVar8->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (pvVar8->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__source != pbVar2) {
    do {
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_170,__source,auto_format);
      cVar5 = std::filesystem::status(&local_170);
      std::filesystem::__cxx11::path::~path(&local_170);
      if (cVar5 == '\x02') {
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&local_130,__source,auto_format);
        std::filesystem::canonical(&local_170);
        const::{lambda(auto:1&&)#1}::operator()((_lambda_auto_1____1_ *)&local_140,&local_170);
      }
      else {
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&local_170,__source,auto_format);
        cVar5 = std::filesystem::status(&local_170);
        std::filesystem::__cxx11::path::~path(&local_170);
        if (cVar5 != '\x01') {
          iVar7 = std::__cxx11::string::compare((char *)__source);
          if (iVar7 == 0) {
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Spec \'","");
            throw_invalid<std::__cxx11::string,char[35]>
                      (&local_78,__source,(char (*) [35])"\' not supported outside of Windows");
          }
          local_170._M_pathname._M_dataplus._M_p = (pointer)&local_170._M_pathname.field_2;
          local_170._M_pathname._M_string_length = 0;
          local_170._M_pathname.field_2._M_local_buf[0] = '\0';
          iVar7 = std::__cxx11::string::compare((char *)__source);
          if (iVar7 != 0) {
            iVar7 = std::__cxx11::string::compare((char *)__source);
            if (iVar7 != 0) {
              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                        ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_130,
                         "((\\d+)\\.(\\d+)\\.(\\d+)\\.(\\d+))\\+?",0x10);
              local_198.field_2._M_allocated_capacity = 0;
              local_198.field_2._8_8_ = 0;
              local_198._M_dataplus._M_p = (pointer)0x0;
              local_198._M_string_length = 0;
              __s._M_current = (__source->_M_dataplus)._M_p;
              bVar6 = std::__detail::
                      __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                                (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )(__s._M_current + __source->_M_string_length),
                                 (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  *)&local_198,
                                 (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_130,
                                 0);
              if (bVar6) {
                if (local_198._M_dataplus._M_p == (pointer)local_198._M_string_length) {
                  bVar6 = false;
                }
                else {
                  bVar6 = ((long)(local_198._M_string_length - (long)local_198._M_dataplus._M_p) >>
                          3) * -0x5555555555555555 - 5U < 0xfffffffffffffffe;
                }
                this_00 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_198._M_string_length + -0x48);
                if (bVar6) {
                  this_00 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(local_198._M_dataplus._M_p + 0x18);
                }
                std::__cxx11::
                sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::str(&local_58,this_00);
                std::__cxx11::string::operator=((string *)&local_170,(string *)&local_58);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_58._M_dataplus._M_p != &local_58.field_2) {
                  operator_delete(local_58._M_dataplus._M_p,
                                  local_58.field_2._M_allocated_capacity + 1);
                }
              }
              if (local_198._M_dataplus._M_p != (pointer)0x0) {
                operator_delete(local_198._M_dataplus._M_p,
                                local_198.field_2._M_allocated_capacity -
                                (long)local_198._M_dataplus._M_p);
              }
              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                        ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_130);
              if (local_170._M_pathname._M_string_length == 0) {
                local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Path \'","");
                throw_invalid<std::__cxx11::string,char[29]>
                          (&local_d8,__source,(char (*) [29])"\' is not a file or directory");
              }
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Spec \'","");
              throw_invalid<std::__cxx11::string,char[35]>
                        (&local_b8,__source,(char (*) [35])"\' not supported outside of Windows");
            }
          }
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Spec \'","");
          throw_invalid<std::__cxx11::string,char[35]>
                    (&local_98,__source,(char (*) [35])"\' not supported outside of Windows");
        }
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&local_130,__source,auto_format);
        std::filesystem::canonical(&local_170);
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_198,local_170._M_pathname._M_dataplus._M_p,
                   local_170._M_pathname._M_dataplus._M_p + local_170._M_pathname._M_string_length);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_108,&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
      }
      std::filesystem::__cxx11::path::~path(&local_170);
      std::filesystem::__cxx11::path::~path(&local_130);
      __source = __source + 1;
    } while (__source != pbVar2);
  }
  psVar4 = local_148;
  p_Var1 = &(local_148->_M_t)._M_impl.super__Rb_tree_header;
  if (local_108._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    (local_148->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (local_148->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (local_148->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (local_148->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    p_Var3 = &(local_148->_M_t)._M_impl;
  }
  else {
    p_Var3 = &local_108._M_impl;
    (local_148->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color =
         local_108._M_impl.super__Rb_tree_header._M_header._M_color;
    (local_148->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_108._M_impl.super__Rb_tree_header._M_header._M_parent;
    (local_148->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         local_108._M_impl.super__Rb_tree_header._M_header._M_left;
    (local_148->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         local_108._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_108._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    (local_148->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
         local_108._M_impl.super__Rb_tree_header._M_node_count;
    local_108._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_108._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_108._M_impl.super__Rb_tree_header._M_header;
    local_108._M_impl.super__Rb_tree_header._M_header._M_right =
         local_108._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  (p_Var3->super__Rb_tree_header)._M_node_count = 0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_108);
  return psVar4;
}

Assistant:

auto files(std::string_view const& name, F directory_filter) const
        {
            std::set<std::string> files;

            auto add_directory = [&](auto&& path)
            {
                for (auto&& file : std::filesystem::directory_iterator(path))
                {
                    if (std::filesystem::is_regular_file(file))
                    {
                        auto filename = file.path().string();

                        if (directory_filter(filename))
                        {
                            files.insert(filename);
                        }
                    }
                }
            };

            for (auto&& path : values(name))
            {
                if (std::filesystem::is_directory(path))
                {
                    add_directory(std::filesystem::canonical(path));
                    continue;
                }

                if (std::filesystem::is_regular_file(path))
                {
                    files.insert(std::filesystem::canonical(path).string());
                    continue;
                }
                if (path == "local")
                {
#if defined(_WIN32) || defined(_WIN64)
                    std::array<char, 260> local{};
#ifdef _WIN64
                    ExpandEnvironmentStringsA("%windir%\\System32\\WinMetadata", local.data(), static_cast<uint32_t>(local.size()));
#else
                    ExpandEnvironmentStringsA("%windir%\\SysNative\\WinMetadata", local.data(), static_cast<uint32_t>(local.size()));
#endif
                    add_directory(local.data());
#else /* defined(_WIN32) || defined(_WIN64) */
                    throw_invalid("Spec '", path, "' not supported outside of Windows");
#endif /* defined(_WIN32) || defined(_WIN64) */
                    continue;
                }

                std::string sdk_version;

                if (path == "sdk" || path == "sdk+")
                {
#if defined(_WIN32) || defined(_WIN64)
                    sdk_version = get_sdk_version();
#else /* defined(_WIN32) || defined(_WIN64) */
                    throw_invalid("Spec '", path, "' not supported outside of Windows");
#endif /* defined(_WIN32) || defined(_WIN64) */
                }
                else
                {
                    std::regex rx(R"(((\d+)\.(\d+)\.(\d+)\.(\d+))\+?)");
                    std::smatch match;

                    if (std::regex_match(path, match, rx))
                    {
                        sdk_version = match[1].str();
                    }
                }

                if (!sdk_version.empty())
                {
#if defined(_WIN32) || defined(_WIN64)
                    auto sdk_path = get_sdk_path();
                    auto xml_path = sdk_path;
                    xml_path /= L"Platforms\\UAP";
                    xml_path /= sdk_version;
                    xml_path /= L"Platform.xml";

                    add_files_from_xml(files, sdk_version, xml_path, sdk_path, xml_requirement::required);

                    if (path.back() != '+')
                    {
                        continue;
                    }

                    for (auto&& item : std::filesystem::directory_iterator(sdk_path / L"Extension SDKs"))
                    {
                        xml_path = item.path() / sdk_version;
                        xml_path /= L"SDKManifest.xml";

                        // Not all Extension SDKs include an SDKManifest.xml file; ignore those which do not (e.g. WindowsIoT).
                        add_files_from_xml(files, sdk_version, xml_path, sdk_path, xml_requirement::optional);
                    }
#else /* defined(_WIN32) || defined(_WIN64) */
                    throw_invalid("Spec '", path, "' not supported outside of Windows");
#endif /* defined(_WIN32) || defined(_WIN64) */

                    continue;
                }

                throw_invalid("Path '", path, "' is not a file or directory");
            }

            return files;
        }